

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O3

void __thiscall
t_java_generator::generate_javax_generated_annotation(t_java_generator *this,ostream *out)

{
  _func_int *p_Var1;
  tm *ptVar2;
  ostream *poVar3;
  _func_int **pp_Var4;
  long lVar5;
  char *pcVar6;
  time_t seconds;
  time_t local_50;
  char *local_48;
  long local_40;
  char local_38 [16];
  
  local_50 = time((time_t *)0x0);
  ptVar2 = localtime(&local_50);
  poVar3 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"@javax.annotation.Generated(value = \"",0x25);
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1d])(&local_48,this);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_48,local_40);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"",1);
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  if (this->undated_generated_annotations_ == true) {
    pcVar6 = ")";
    lVar5 = 1;
  }
  else {
    poVar3 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", date = \"",10);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,ptVar2->tm_year + 0x76c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"-",1);
    pp_Var4 = poVar3->_vptr_basic_ostream;
    p_Var1 = (_func_int *)((long)&poVar3->_vptr_basic_ostream + (long)pp_Var4[-3]);
    if ((&poVar3->field_0xe1)[(long)pp_Var4[-3]] == '\0') {
      std::ios::widen((char)p_Var1);
      p_Var1[0xe1] = (code)0x1;
      pp_Var4 = poVar3->_vptr_basic_ostream;
    }
    p_Var1[0xe0] = (code)0x30;
    *(undefined8 *)(&poVar3->field_0x10 + (long)pp_Var4[-3]) = 2;
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,ptVar2->tm_mon + 1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"-",1);
    pp_Var4 = poVar3->_vptr_basic_ostream;
    p_Var1 = (_func_int *)((long)&poVar3->_vptr_basic_ostream + (long)pp_Var4[-3]);
    if ((&poVar3->field_0xe1)[(long)pp_Var4[-3]] == '\0') {
      std::ios::widen((char)p_Var1);
      p_Var1[0xe1] = (code)0x1;
      pp_Var4 = poVar3->_vptr_basic_ostream;
    }
    p_Var1[0xe0] = (code)0x30;
    *(undefined8 *)(&poVar3->field_0x10 + (long)pp_Var4[-3]) = 2;
    out = (ostream *)std::ostream::operator<<(poVar3,ptVar2->tm_mday);
    pcVar6 = "\")";
    lVar5 = 2;
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,pcVar6,lVar5);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  return;
}

Assistant:

void t_java_generator::generate_javax_generated_annotation(ostream& out) {
  time_t seconds = time(nullptr);
  struct tm* now = localtime(&seconds);
  indent(out) << "@javax.annotation.Generated(value = \"" << autogen_summary() << "\"";
  if (undated_generated_annotations_) {
    out << ")" << endl;
  } else {
    indent(out) << ", date = \"" << (now->tm_year + 1900) << "-" << setfill('0') << setw(2)
                << (now->tm_mon + 1) << "-" << setfill('0') << setw(2) << now->tm_mday
                << "\")" << endl;
  }
}